

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natpmp.cpp
# Opt level: O0

void __thiscall libtorrent::natpmp::close_impl(natpmp *this)

{
  bool bVar1;
  double in_XMM0_Qa;
  port_mapping_t local_38;
  strong_typedef<int,_libtorrent::port_mapping_tag,_void> local_34;
  reference local_30;
  mapping_t *m;
  iterator __end1;
  iterator __begin1;
  vector<mapping_t,_port_mapping_t> *__range1;
  natpmp *this_local;
  
  this->m_abort = true;
  log(this,in_XMM0_Qa);
  if ((this->m_disabled & 1U) == 0) {
    __end1 = ::std::
             vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>::
             begin(&(this->m_mappings).
                    super_vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
                  );
    m = (mapping_t *)
        ::std::vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
        ::end(&(this->m_mappings).
               super_vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
             );
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<libtorrent::natpmp::mapping_t_*,_std::vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>_>
                                       *)&m), bVar1) {
      local_30 = __gnu_cxx::
                 __normal_iterator<libtorrent::natpmp::mapping_t_*,_std::vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>_>
                 ::operator*(&__end1);
      if ((local_30->super_base_mapping).protocol != none) {
        (local_30->super_base_mapping).act = del;
      }
      __gnu_cxx::
      __normal_iterator<libtorrent::natpmp::mapping_t_*,_std::vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>_>
      ::operator++(&__end1);
    }
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::cancel(&this->m_refresh_timer);
    libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>::strong_typedef
              (&local_34,-1);
    (this->m_currently_mapping).m_val = local_34.m_val;
    memset(&local_38,0,4);
    update_mapping(this,local_38);
  }
  return;
}

Assistant:

void natpmp::close_impl()
{
	TORRENT_ASSERT(is_single_thread());
	m_abort = true;
#ifndef TORRENT_DISABLE_LOGGING
	log("closing");
#endif
	if (m_disabled) return;
	for (auto& m : m_mappings)
	{
		if (m.protocol == portmap_protocol::none) continue;
		m.act = portmap_action::del;
	}
	m_refresh_timer.cancel();
	m_currently_mapping = port_mapping_t{-1};
	update_mapping(port_mapping_t{});
}